

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void SpiritKarma<unsigned_short>(void)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  unsigned_short n;
  char *__s;
  char buf [64];
  char *beg;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  __s = _endl<char,std::char_traits<char>> + (*_endl<char,std::char_traits<char>> == '*');
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"spirit karma",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  n = 0;
  lVar3 = std::chrono::_V2::steady_clock::now();
  do {
    buf[0x38] = '\0';
    buf[0x39] = '\0';
    buf[0x3a] = '\0';
    buf[0x3b] = '\0';
    buf[0x3c] = '\0';
    buf[0x3d] = '\0';
    buf[0x3e] = '\0';
    buf[0x3f] = '\0';
    beg._6_2_ = n;
    boost::spirit::karma::int_inserter<10u,boost::spirit::unused_type,boost::spirit::unused_type>::
    call<boost::spirit::karma::detail::output_iterator<char*,mpl_::int_<15>,boost::spirit::unused_type>,unsigned_short>
              ((output_iterator<char_*,_mpl_::int_<15>,_boost::spirit::unused_type> *)(buf + 0x38),n
               ,(unsigned_short *)((long)&beg + 6),0);
    n = n + 1;
  } while (n != 0xffff);
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void SpiritKarma()
{
    char buf[64];
    PROFILING_BEGIN(T, "spirit karma")
    char *beg = buf;
    boost::spirit::karma::generate(beg, boost::spirit::karma::auto_, i);
    *beg = 0;
    PROFILING_END()
}